

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O2

bool __thiscall
adios2::core::engine::DataManMonitor::FileExisted(DataManMonitor *this,string *filename)

{
  undefined1 uVar1;
  ifstream checkFile;
  
  std::ifstream::ifstream(&checkFile,(filename->_M_dataplus)._M_p,_S_in);
  uVar1 = std::__basic_file<char>::is_open();
  std::ifstream::~ifstream(&checkFile);
  return (bool)uVar1;
}

Assistant:

void DataManMonitor::OutputCsv(const std::string &filename)
{
    bool fileExists = FileExisted(filename + ".csv");
    std::ofstream file((filename + ".csv").c_str(), std::fstream::out | std::fstream::app);
    if (!fileExists)
    {
        file << "bandwidth, latency, precision, completeness, size, "
                "aggregation, compression, threading"
             << std::endl;
    }
    file << floor(log2(m_TotalRate)) << ", ";
    file << floor(log2(m_AccumulatedLatency / static_cast<double>(m_CurrentStep + 1))) - 8 << ", ";
    if (m_RequiredAccuracy == 0)
    {
        file << 0 << ", ";
    }
    else if (m_RequiredAccuracy < 0.00001)
    {
        file << 1 << ", ";
    }
    else
    {
        file << round(log10(m_RequiredAccuracy)) + 6 << ", ";
    }
    file << ceil(log2(m_DropRate * 100 + 1)) << ", ";
    file << floor(log2(m_StepBytes)) - 10 << ", ";
    file << ceil(log2(m_CombiningSteps)) << ", ";
    if (m_CompressionAccuracy == 0)
    {
        file << 0 << ", ";
    }
    else if (m_CompressionAccuracy < 0.00001)
    {
        file << 1 << ", ";
    }
    else
    {
        file << round(log10(m_CompressionAccuracy)) + 6 << ", ";
    }
    file << static_cast<int>(m_WriterThreading) * 2 + static_cast<int>(m_ReaderThreading)
         << std::endl;
    file.close();
}